

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O0

MPP_RET __thiscall mpp_list::wait_lt(mpp_list *this,RK_S64 timeout,RK_S32 val)

{
  RK_S32 RVar1;
  void *__stat_loc;
  RK_S32 val_local;
  RK_S64 timeout_local;
  mpp_list *this_local;
  
  __stat_loc = (void *)timeout;
  RVar1 = list_size(this);
  if (RVar1 < val) {
    this_local._4_4_ = MPP_OK;
  }
  else if (timeout == 0) {
    this_local._4_4_ = MPP_NOK;
  }
  else {
    if (timeout < 0) {
      MppMutexCond::wait(&this->super_MppMutexCond,__stat_loc);
    }
    else {
      MppMutexCond::wait(&this->super_MppMutexCond,(void *)timeout);
    }
    RVar1 = list_size(this);
    this_local._4_4_ = MPP_NOK;
    if (RVar1 < val) {
      this_local._4_4_ = MPP_OK;
    }
  }
  return this_local._4_4_;
}

Assistant:

MPP_RET mpp_list::wait_lt(RK_S64 timeout, RK_S32 val)
{
    if (list_size() < val)
        return MPP_OK;

    if (!timeout)
        return MPP_NOK;

    if (timeout < 0)
        wait();
    else
        wait(timeout);

    return list_size() < val ? MPP_OK : MPP_NOK;
}